

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Makowski.hpp
# Opt level: O3

HRRDoubletStep * __thiscall
Makowski_HRR::DoubletStep_
          (HRRDoubletStep *__return_storage_ptr__,Makowski_HRR *this,Doublet *target,
          RRStepType steptype)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Gaussian *pGVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  runtime_error *this_00;
  int iVar10;
  long lVar11;
  Gaussian *pGVar12;
  XYZStep XVar13;
  int *piVar14;
  ExpList ijk;
  string tag;
  Doublet src1d;
  Doublet src2d;
  reverse_iterator<const_int_*> it;
  undefined8 local_140;
  int local_138;
  int local_134;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  ulong local_110;
  DoubletType local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  int iStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  int local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  Gaussian *local_c8;
  int iStack_c0;
  int iStack_bc;
  undefined4 uStack_b8;
  undefined8 uStack_b4;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  Gaussian *local_88;
  undefined4 uStack_80;
  int iStack_7c;
  undefined4 uStack_78;
  undefined8 uStack_74;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  Gaussian *local_48;
  Gaussian *local_40;
  long local_38;
  
  local_130 = local_120;
  pcVar1 = (target->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar1,pcVar1 + (target->tag)._M_string_length);
  if ((target->right).ijk._M_elems[0] + (target->left).ijk._M_elems[1] +
      (target->left).ijk._M_elems[2] + (target->left).ijk._M_elems[0] +
      (target->right).ijk._M_elems[1] + (target->right).ijk._M_elems[2] != 0) {
    local_40 = &target->left;
    local_48 = &target->right;
    pGVar12 = local_48;
    pGVar5 = local_40;
    if ((steptype & ~K) == I) {
      pGVar12 = local_40;
      pGVar5 = local_48;
    }
    local_138 = (pGVar12->ijk)._M_elems[2];
    local_140 = *(undefined8 *)(pGVar12->ijk)._M_elems;
    std::__insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(&local_140,&local_134);
    piVar14 = (int *)&local_140;
    if ((int)local_140 == 0) {
      if (local_140._4_4_ == 0) {
        piVar14 = &local_134;
        if (local_138 != 0) {
          piVar14 = &local_138;
        }
      }
      else {
        piVar14 = (int *)((long)&local_140 + 4);
      }
    }
    local_c8 = pGVar12 + 1;
    local_88 = pGVar12;
    std::__find_if<std::reverse_iterator<int_const*>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
              (&local_38,&local_c8,&local_88,piVar14);
    local_110 = (long)(pGVar12 + 1) - local_38;
    iStack_c0 = (pGVar12->ijk)._M_elems[2];
    local_c8 = *(Gaussian **)(pGVar12->ijk)._M_elems;
    lVar11 = (long)(local_110 * -0x40000000 + 0x200000000) >> 0x20;
    piVar14 = (int *)((long)&local_c8 + lVar11 * 4);
    *piVar14 = *piVar14 + -1;
    iVar10 = iStack_c0;
    pGVar12 = local_c8;
    iStack_c0 = (pGVar5->ijk)._M_elems[2];
    local_c8 = *(Gaussian **)(pGVar5->ijk)._M_elems;
    piVar14 = (int *)((long)&local_c8 + lVar11 * 4);
    *piVar14 = *piVar14 + 1;
    local_a8 = local_98;
    local_a0 = 0;
    local_98[0] = 0;
    local_68 = local_58;
    local_60 = 0;
    local_58[0] = 0;
    uStack_104 = SUB84(local_c8,0);
    uStack_100 = (undefined4)((ulong)local_c8 >> 0x20);
    local_f8 = SUB84(pGVar12,0);
    uVar6 = local_f8;
    uStack_f4 = (undefined4)((ulong)pGVar12 >> 0x20);
    uVar7 = uStack_f4;
    if ((steptype & ~K) == I) {
      local_108 = target->type;
      iStack_fc = iVar10;
      local_f0 = iStack_c0;
      uVar8 = uStack_104;
      uStack_104 = local_f8;
      uVar9 = uStack_100;
      uStack_100 = uStack_f4;
      local_f8 = uVar8;
      uStack_f4 = uVar9;
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)local_e8,local_130,local_130 + local_128);
      local_c8 = (Gaussian *)CONCAT44(uStack_104,local_108);
      uStack_b4 = CONCAT44(local_f0,uStack_f4);
      uStack_b8 = local_f8;
      iStack_c0 = uStack_100;
      iStack_bc = iStack_fc;
      std::__cxx11::string::operator=((string *)&local_a8,(string *)local_e8);
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0]);
      }
      local_108 = target->type;
      iStack_fc = iVar10;
      uVar2 = *(undefined8 *)(local_48->ijk)._M_elems;
      local_f8 = (undefined4)uVar2;
      uStack_f4 = (undefined4)((ulong)uVar2 >> 0x20);
      local_f0 = (local_48->ijk)._M_elems[2];
      uStack_104 = uVar6;
      uStack_100 = uVar7;
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)local_e8,local_130,local_130 + local_128);
    }
    else {
      local_108 = target->type;
      iStack_fc = iStack_c0;
      local_f0 = iVar10;
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)local_e8,local_130,local_130 + local_128);
      local_c8 = (Gaussian *)CONCAT44(uStack_104,local_108);
      uStack_b4 = CONCAT44(local_f0,uStack_f4);
      uStack_b8 = local_f8;
      iStack_c0 = uStack_100;
      iStack_bc = iStack_fc;
      std::__cxx11::string::operator=((string *)&local_a8,(string *)local_e8);
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0]);
      }
      local_108 = target->type;
      uVar2 = *(undefined8 *)(local_40->ijk)._M_elems;
      uStack_104 = (undefined4)uVar2;
      uStack_100 = (undefined4)((ulong)uVar2 >> 0x20);
      iStack_fc = (local_40->ijk)._M_elems[2];
      local_f0 = iVar10;
      local_f8 = uVar6;
      uStack_f4 = uVar7;
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)local_e8,local_130,local_130 + local_128);
    }
    local_88 = (Gaussian *)CONCAT44(uStack_104,local_108);
    uStack_74 = CONCAT44(local_f0,uStack_f4);
    uStack_78 = local_f8;
    uStack_80 = uStack_100;
    iStack_7c = iStack_fc;
    std::__cxx11::string::operator=((string *)&local_68,(string *)local_e8);
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0]);
    }
    iVar10 = (int)(local_110 >> 2);
    XVar13 = STEP_X;
    if (iVar10 != 2) {
      XVar13 = (iVar10 != 1) + STEP_Y;
    }
    __return_storage_ptr__->type = steptype;
    iVar10 = (target->left).ijk._M_elems[0];
    uVar2 = *(undefined8 *)((target->left).ijk._M_elems + 1);
    uVar3 = *(undefined8 *)((target->left).ijk._M_elems + 2);
    uVar4 = *(undefined8 *)((target->right).ijk._M_elems + 1);
    (__return_storage_ptr__->target).type = target->type;
    (__return_storage_ptr__->target).left.ijk._M_elems[0] = iVar10;
    *(undefined8 *)((__return_storage_ptr__->target).left.ijk._M_elems + 1) = uVar2;
    *(undefined8 *)((__return_storage_ptr__->target).left.ijk._M_elems + 2) = uVar3;
    *(undefined8 *)((__return_storage_ptr__->target).right.ijk._M_elems + 1) = uVar4;
    (__return_storage_ptr__->target).tag._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->target).tag.field_2;
    pcVar1 = (target->tag)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->target).tag,pcVar1,
               pcVar1 + (target->tag)._M_string_length);
    *(ulong *)((__return_storage_ptr__->src)._M_elems[0].left.ijk._M_elems + 2) =
         CONCAT44(uStack_b8,iStack_bc);
    *(undefined8 *)((__return_storage_ptr__->src)._M_elems[0].right.ijk._M_elems + 1) = uStack_b4;
    *(Gaussian **)(__return_storage_ptr__->src)._M_elems = local_c8;
    *(ulong *)((__return_storage_ptr__->src)._M_elems[0].left.ijk._M_elems + 1) =
         CONCAT44(iStack_bc,iStack_c0);
    (__return_storage_ptr__->src)._M_elems[0].tag._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->src)._M_elems[0].tag.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->src)._M_elems[0].tag,local_a8,local_a8 + local_a0
              );
    *(ulong *)((__return_storage_ptr__->src)._M_elems[1].left.ijk._M_elems + 2) =
         CONCAT44(uStack_78,iStack_7c);
    *(undefined8 *)((__return_storage_ptr__->src)._M_elems[1].right.ijk._M_elems + 1) = uStack_74;
    *(Gaussian **)((__return_storage_ptr__->src)._M_elems + 1) = local_88;
    *(ulong *)((__return_storage_ptr__->src)._M_elems[1].left.ijk._M_elems + 1) =
         CONCAT44(iStack_7c,uStack_80);
    (__return_storage_ptr__->src)._M_elems[1].tag._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->src)._M_elems[1].tag.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->src)._M_elems[1].tag,local_68,local_68 + local_60
              );
    __return_storage_ptr__->xyz = XVar13;
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8);
    }
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Cannot HRR step to an s doublet!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual HRRDoubletStep DoubletStep_(const Doublet & target, RRStepType steptype)
        {
            const std::string tag = target.tag;

            if(target.am() == 0)
                throw std::runtime_error("Cannot HRR step to an s doublet!");

            const Gaussian * t;
            const Gaussian * t2;

            if(steptype == RRStepType::I || steptype == RRStepType::K)  // Going J->I or L->K
            {
                t = &target.left;
                t2 = &target.right;
            }
            else // Going I->J or K->L
            {
                t = &target.right;
                t2 = &target.left;
            }
                

            // idx is the xyz index
            ExpList ijk = t->ijk;
            std::sort(ijk.begin(), ijk.end());
            auto v = std::find_if(ijk.begin(), ijk.end(), [](int i) { return i != 0; });
            auto it = std::find(t->ijk.rbegin(), t->ijk.rend(), *v); 
            int idx = 2 - std::distance(t->ijk.rbegin(), it);  // remember we are working with reverse iterators

            // gaussian common to both src1 and src2
            Gaussian common(t->StepDown(idx, 1));

            // for src1
            Gaussian src1g(t2->StepUp(idx, 1));

            // create new doublets
            Doublet src1d, src2d;
            if(steptype == RRStepType::I || steptype == RRStepType::K)
            {
                src1d = Doublet{target.type, common, src1g, tag};
                src2d = Doublet{target.type, common, target.right, tag};
            }
            else
            {
                src1d = Doublet{target.type, src1g, common, tag};
                src2d = Doublet{target.type, target.left, common, tag};
            }
           
            XYZStep xyzstep = IdxToXYZStep(idx);

            // Create the HRR doublet step
            HRRDoubletStep hrr{steptype,
                               target, 
                               src1d, src2d,
                               xyzstep};
            return hrr;
        }